

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-segments.cpp
# Opt level: O2

Point2 __thiscall msdfgen::CubicSegment::point(CubicSegment *this,double param)

{
  Vector2 VVar1;
  Vector2 VVar2;
  Vector2 b;
  Point2 PVar3;
  
  VVar1 = mix<msdfgen::Vector2,double>(this->p[1],this->p[2],param);
  VVar2.x = this->p[0].x;
  VVar2.y = this->p[0].y;
  VVar2 = mix<msdfgen::Vector2,double>(VVar2,this->p[1],param);
  VVar2 = mix<msdfgen::Vector2,double>(VVar2,VVar1,param);
  b = mix<msdfgen::Vector2,double>(this->p[2],this->p[3],param);
  VVar1 = mix<msdfgen::Vector2,double>(VVar1,b,param);
  VVar2 = mix<msdfgen::Vector2,double>(VVar2,VVar1,param);
  PVar3.x = VVar2.x;
  PVar3.y = VVar2.y;
  return PVar3;
}

Assistant:

Point2 CubicSegment::point(double param) const {
    Vector2 p12 = mix(p[1], p[2], param);
    return mix(mix(mix(p[0], p[1], param), p12, param), mix(p12, mix(p[2], p[3], param), param), param);
}